

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsObjectiveFunction.cpp
# Opt level: O2

void __thiscall
HighsObjectiveFunction::HighsObjectiveFunction
          (HighsObjectiveFunction *this,HighsMipSolver *mipsolver)

{
  vector<int,_std::allocator<int>_> *this_00;
  HighsInt i;
  HighsLp *pHVar1;
  pointer pHVar2;
  bool bVar3;
  int iVar4;
  int *piVar5;
  int *piVar6;
  int *piVar7;
  int __tmp;
  HighsInt HVar8;
  int *piVar9;
  int __tmp_1;
  vector<int,_std::allocator<int>_> *__range1;
  int *piVar10;
  double dVar11;
  anon_class_8_1_c15d7e07 local_60;
  int *local_58;
  int *local_50;
  vector<int,_std::allocator<int>_> *local_48;
  vector<int,_std::allocator<int>_> *local_40;
  vector<int,_std::allocator<int>_> *local_38;
  
  pHVar1 = mipsolver->model_;
  this->model = pHVar1;
  this_00 = &this->objectiveNonzeros;
  (this->objectiveNonzeros).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->objectiveNonzeros).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->objectiveNonzeros).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->objectiveVals).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->objectiveVals).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->objectiveVals).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->cliquePartitionStart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cliquePartitionStart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cliquePartitionStart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->colToPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->colToPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->colToPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_40 = &this->colToPartition;
  local_38 = &this->cliquePartitionStart;
  std::vector<int,_std::allocator<int>_>::reserve(this_00,(long)pHVar1->num_col_);
  iVar4 = 0;
  while( true ) {
    local_60.mipsolver._0_4_ = iVar4;
    pHVar1 = this->model;
    if (pHVar1->num_col_ <= iVar4) break;
    dVar11 = (pHVar1->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[iVar4];
    if ((dVar11 != 0.0) || (NAN(dVar11))) {
      std::vector<int,_std::allocator<int>_>::push_back(this_00,(value_type_conflict2 *)&local_60);
      iVar4 = (int)local_60.mipsolver;
    }
    iVar4 = iVar4 + 1;
  }
  local_60.mipsolver._0_4_ = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::resize
            (&this->colToPartition,(long)pHVar1->num_col_,(value_type_conflict2 *)&local_60);
  std::vector<int,_std::allocator<int>_>::resize(&this->cliquePartitionStart,1);
  piVar9 = (this->objectiveNonzeros).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar10 = (this->objectiveNonzeros).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish;
  piVar5 = piVar10;
  piVar7 = piVar9;
  if (piVar9 != piVar10) {
    do {
      while( true ) {
        piVar6 = piVar5;
        if (piVar7 == piVar5) goto LAB_002d5f31;
        iVar4 = *piVar7;
        pHVar2 = (mipsolver->model_->integrality_).
                 super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (pHVar2[iVar4] == kContinuous) break;
        piVar7 = piVar7 + 1;
      }
      do {
        piVar5 = piVar5 + -1;
        piVar6 = piVar7;
        if (piVar5 == piVar7) goto LAB_002d5f31;
      } while (pHVar2[*piVar5] == kContinuous);
      *piVar7 = *piVar5;
      *piVar5 = iVar4;
      piVar7 = piVar7 + 1;
    } while( true );
  }
  this->numIntegral = 0;
  this->numBinary = 0;
  dVar11 = 1.0;
  goto LAB_002d600b;
LAB_002d5f31:
  iVar4 = (int)((ulong)((long)piVar6 - (long)piVar9) >> 2);
  this->numIntegral = iVar4;
  if (iVar4 == 0) {
    HVar8 = 0;
  }
  else {
    piVar5 = piVar9 + iVar4;
    local_60.mipsolver = mipsolver;
    local_50 = piVar9;
    local_48 = this_00;
    while (piVar7 = piVar5, piVar9 != piVar5) {
      HVar8 = *piVar9;
      bVar3 = HighsObjectiveFunction::anon_class_8_1_c15d7e07::operator()(&local_60,HVar8);
      if (bVar3) {
        piVar9 = piVar9 + 1;
      }
      else {
        do {
          local_58 = piVar10;
          piVar5 = piVar5 + -1;
          piVar7 = piVar9;
          piVar10 = local_58;
          if (piVar5 == piVar9) goto LAB_002d5fb1;
          i = *piVar5;
          bVar3 = HighsObjectiveFunction::anon_class_8_1_c15d7e07::operator()(&local_60,i);
          piVar10 = local_58;
        } while (!bVar3);
        *piVar9 = i;
        *piVar5 = HVar8;
        piVar9 = piVar9 + 1;
      }
    }
LAB_002d5fb1:
    HVar8 = (HighsInt)((ulong)((long)piVar7 - (long)local_50) >> 2);
    piVar9 = local_50;
  }
  this->numBinary = HVar8;
  std::vector<double,_std::allocator<double>_>::reserve
            (&this->objectiveVals,(long)piVar10 - (long)piVar9 >> 2);
  piVar10 = (this->objectiveNonzeros).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (piVar9 = (this->objectiveNonzeros).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start; piVar9 != piVar10; piVar9 = piVar9 + 1) {
    std::vector<double,_std::allocator<double>_>::push_back
              (&this->objectiveVals,
               (this->model->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + *piVar9);
  }
  dVar11 = 0.0;
LAB_002d600b:
  this->objIntScale = dVar11;
  return;
}

Assistant:

HighsObjectiveFunction::HighsObjectiveFunction(const HighsMipSolver& mipsolver)
    : model(mipsolver.model_) {
  objectiveNonzeros.reserve(model->num_col_);

  for (HighsInt i = 0; i < model->num_col_; ++i) {
    if (model->col_cost_[i] != 0.0) {
      objectiveNonzeros.push_back(i);
    }
  }

  colToPartition.resize(model->num_col_, -1);
  cliquePartitionStart.resize(1);

  if (objectiveNonzeros.empty()) {
    numBinary = 0;
    numIntegral = 0;
    objIntScale = 1.0;
    return;
  }

  numIntegral =
      std::partition(objectiveNonzeros.begin(), objectiveNonzeros.end(),
                     [&](HighsInt i) {
                       return mipsolver.variableType(i) !=
                              HighsVarType::kContinuous;
                     }) -
      objectiveNonzeros.begin();

  if (numIntegral == 0)
    numBinary = 0;
  else
    numBinary =
        std::partition(objectiveNonzeros.begin(),
                       objectiveNonzeros.begin() + numIntegral,
                       [&](HighsInt i) {
                         return mipsolver.model_->col_lower_[i] == 0.0 &&
                                mipsolver.model_->col_upper_[i] == 1.0;
                       }) -
        objectiveNonzeros.begin();

  objectiveVals.reserve(objectiveNonzeros.size());
  for (HighsInt i : objectiveNonzeros)
    objectiveVals.push_back(model->col_cost_[i]);

  objIntScale = 0.0;
}